

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Query_PDU::SetRequestedPerimeterPointCoordinates
          (Minefield_Query_PDU *this,
          vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
          *PPC)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  *PPC_local;
  Minefield_Query_PDU *this_local;
  
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength +
       (ushort)this->m_ui8NumPerimPoints * -8;
  std::
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ::operator=(&this->m_vPoints,PPC);
  sVar1 = std::
          vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
          ::size(&this->m_vPoints);
  this->m_ui8NumPerimPoints = (KUINT8)sVar1;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength +
       (ushort)this->m_ui8NumPerimPoints * 8;
  return;
}

Assistant:

void Minefield_Query_PDU::SetRequestedPerimeterPointCoordinates( const std::vector<PerimeterPointCoordinate> & PPC )
{
    // Subtract old values from pdu length.
    m_ui16PDULength -= m_ui8NumPerimPoints * PerimeterPointCoordinate::PERIMETER_POINT_COORDINATE_SIZE;

    m_vPoints = PPC;
    m_ui8NumPerimPoints = m_vPoints.size();

    // Calculate the new size
    m_ui16PDULength += m_ui8NumPerimPoints * PerimeterPointCoordinate::PERIMETER_POINT_COORDINATE_SIZE;
}